

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_CopyObject
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_OBJECT_HANDLE hObject,
          CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,CK_OBJECT_HANDLE_PTR phNewObject)

{
  SessionObject *pSVar1;
  Token *this_00;
  byte extraout_AL;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  CK_STATE CVar5;
  CK_OBJECT_HANDLE CVar6;
  long in_RCX;
  P11Object *in_RDI;
  ulong in_R8;
  CK_OBJECT_HANDLE *in_R9;
  P11Object *newp11object;
  ByteString value;
  OSAttribute attr;
  CK_ATTRIBUTE_TYPE attrType;
  OSObject *newobject;
  CK_ULONG i;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  CK_BBOOL isCopyable;
  CK_RV rv;
  CK_BBOOL wasPrivate;
  CK_BBOOL wasOnToken;
  OSObject *object;
  Token *token;
  Slot *slot;
  Session *session;
  Session *in_stack_fffffffffffffd78;
  OSAttribute *in_stack_fffffffffffffd80;
  ByteString *in_stack_fffffffffffffd90;
  undefined5 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9d;
  byte in_stack_fffffffffffffd9e;
  byte in_stack_fffffffffffffd9f;
  ByteString *pBVar7;
  undefined6 in_stack_fffffffffffffdb0;
  ByteString *in_stack_fffffffffffffdc0;
  HandleManager *in_stack_fffffffffffffdc8;
  ByteString *in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffddf;
  Token *in_stack_fffffffffffffde0;
  int local_208;
  undefined1 local_200 [7];
  undefined1 in_stack_fffffffffffffe07;
  CK_SESSION_HANDLE in_stack_fffffffffffffe08;
  CK_SLOT_ID in_stack_fffffffffffffe10;
  SessionObjectStore *in_stack_fffffffffffffe18;
  CK_VOID_PTR in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  HandleManager *in_stack_fffffffffffffe58;
  CK_SLOT_ID in_stack_fffffffffffffe60;
  HandleManager *in_stack_fffffffffffffe68;
  undefined1 local_160 [56];
  OSAttribute local_128;
  ByteString *local_88;
  SessionObject *local_80;
  ulong local_78;
  byte local_6b;
  byte local_6a;
  byte local_69;
  CK_RV local_68;
  byte local_5a;
  byte local_59;
  long *local_58;
  Token *local_50;
  Slot *local_48;
  Session *local_40;
  CK_OBJECT_HANDLE *local_38;
  ulong local_30;
  long local_28;
  CK_RV local_8;
  
  if (((ulong)in_RDI->osobject & 1) == 0) {
    local_8 = 400;
  }
  else if (in_RCX == 0) {
    local_8 = 7;
  }
  else if (in_R9 == (CK_OBJECT_HANDLE *)0x0) {
    local_8 = 7;
  }
  else {
    *in_R9 = 0;
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_40 = (Session *)
               HandleManager::getSession
                         (in_stack_fffffffffffffdc8,(CK_SESSION_HANDLE)in_stack_fffffffffffffdc0);
    if (local_40 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      local_48 = Session::getSlot(local_40);
      if (local_48 == (Slot *)0x0) {
        local_8 = 5;
      }
      else {
        local_50 = Session::getToken(local_40);
        if (local_50 == (Token *)0x0) {
          local_8 = 5;
        }
        else {
          local_58 = (long *)HandleManager::getObject
                                       (in_stack_fffffffffffffdc8,
                                        (CK_OBJECT_HANDLE)in_stack_fffffffffffffdc0);
          if ((local_58 == (long *)0x0) ||
             (uVar4 = (**(code **)(*local_58 + 0x50))(), (uVar4 & 1) == 0)) {
            local_8 = 0x82;
          }
          else {
            local_59 = (**(code **)(*local_58 + 0x20))(local_58,1,0);
            local_59 = local_59 & 1;
            local_5a = (**(code **)(*local_58 + 0x20))(local_58,2,1);
            local_5a = local_5a & 1;
            CVar5 = Session::getState(in_stack_fffffffffffffd78);
            local_68 = haveRead(CVar5,local_59,local_5a);
            if (local_68 == 0) {
              local_69 = (**(code **)(*local_58 + 0x20))(local_58,0x171,1);
              local_69 = local_69 & 1;
              if (local_69 == 0) {
                local_8 = 0x1b;
              }
              else {
                local_6a = local_59;
                local_6b = local_5a;
                for (local_78 = 0; local_78 < local_30; local_78 = local_78 + 1) {
                  if ((*(long *)(local_28 + local_78 * 0x18) == 1) &&
                     (*(long *)(local_28 + local_78 * 0x18 + 0x10) == 1)) {
                    local_6a = **(byte **)(local_28 + local_78 * 0x18 + 8);
                  }
                  else if ((*(long *)(local_28 + local_78 * 0x18) == 2) &&
                          (*(long *)(local_28 + local_78 * 0x18 + 0x10) == 1)) {
                    local_6b = **(byte **)(local_28 + local_78 * 0x18 + 8);
                  }
                }
                if ((local_5a == 0) || (local_6b != 0)) {
                  CVar5 = Session::getState(in_stack_fffffffffffffd78);
                  local_68 = haveWrite(CVar5,local_6a,local_6b);
                  if (local_68 == 0) {
                    local_80 = (SessionObject *)0x0;
                    if (local_6a == 0) {
                      in_stack_fffffffffffffde0 = *(Token **)&(in_RDI->attributes)._M_t._M_impl;
                      Slot::getSlotID(local_48);
                      local_80 = SessionObjectStore::createObject
                                           (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                                            in_stack_fffffffffffffe08,
                                            (bool)in_stack_fffffffffffffe07);
                    }
                    else {
                      local_80 = (SessionObject *)Token::createObject((Token *)0x163bb0);
                    }
                    if (local_80 == (SessionObject *)0x0) {
                      local_8 = 5;
                    }
                    else {
                      uVar2 = (*(local_80->super_OSObject)._vptr_OSObject[0xb])(local_80,1);
                      if ((uVar2 & 1) == 0) {
                        (*(local_80->super_OSObject)._vptr_OSObject[0xe])();
                        local_8 = 6;
                      }
                      else {
                        local_88 = (ByteString *)0x0;
                        while( true ) {
                          uVar4 = (**(code **)(*local_58 + 0x10))(local_58,local_88);
                          iVar3 = (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
                          if ((uVar4 & 1) == 0) break;
                          (**(code **)(*local_58 + 0x18))(&local_128,local_58,local_88);
                          if (((local_5a == 0) && (local_6b != 0)) &&
                             (in_stack_fffffffffffffddf =
                                   OSAttribute::isByteStringAttribute(&local_128),
                             (bool)in_stack_fffffffffffffddf)) {
                            in_stack_fffffffffffffdd0 = OSAttribute::getByteStringValue(&local_128);
                            in_stack_fffffffffffffdc8 =
                                 (HandleManager *)ByteString::size((ByteString *)0x163d07);
                            if (in_stack_fffffffffffffdc8 == (HandleManager *)0x0)
                            goto LAB_00163ec6;
                            ByteString::ByteString((ByteString *)0x163d2a);
                            this_00 = local_50;
                            in_stack_fffffffffffffdc0 = OSAttribute::getByteStringValue(&local_128);
                            Token::encrypt(this_00,(char *)in_stack_fffffffffffffdc0,(int)local_160)
                            ;
                            pSVar1 = local_80;
                            in_stack_fffffffffffffd9e = 1;
                            if ((extraout_AL & 1) != 0) {
                              pBVar7 = local_88;
                              OSAttribute::OSAttribute
                                        ((OSAttribute *)
                                         CONCAT17(extraout_AL,CONCAT16(1,in_stack_fffffffffffffdb0))
                                         ,local_88);
                              iVar3 = (*(pSVar1->super_OSObject)._vptr_OSObject[8])
                                                (pSVar1,pBVar7,local_200);
                              in_stack_fffffffffffffd9f = (byte)iVar3;
                              in_stack_fffffffffffffd9e = in_stack_fffffffffffffd9f ^ 0xff;
                              OSAttribute::~OSAttribute(in_stack_fffffffffffffd80);
                            }
                            if ((in_stack_fffffffffffffd9e & 1) == 0) {
                              local_208 = 0;
                            }
                            else {
                              local_68 = 6;
                              local_208 = 5;
                            }
                            ByteString::~ByteString((ByteString *)0x163ea1);
                            if (local_208 == 0) goto LAB_00163f12;
                          }
                          else {
LAB_00163ec6:
                            uVar2 = (*(local_80->super_OSObject)._vptr_OSObject[8])
                                              (local_80,local_88,&local_128);
                            in_stack_fffffffffffffd9d = (undefined1)uVar2;
                            if ((uVar2 & 1) == 0) {
                              local_68 = 6;
                              local_208 = 5;
                            }
                            else {
LAB_00163f12:
                              in_stack_fffffffffffffd90 =
                                   (ByteString *)(**(code **)(*local_58 + 0x38))(local_58,local_88);
                              local_208 = 0;
                              local_88 = in_stack_fffffffffffffd90;
                            }
                          }
                          OSAttribute::~OSAttribute(in_stack_fffffffffffffd80);
                          iVar3 = (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
                          if ((local_208 != 0) || (local_88 == (ByteString *)0x0))
                          goto LAB_00163f77;
                        }
                        local_68 = 6;
LAB_00163f77:
                        if (local_68 == 0) {
                          uVar2 = (*(local_80->super_OSObject)._vptr_OSObject[0xc])();
                          if ((uVar2 & 1) == 0) {
                            local_68 = 6;
                          }
                        }
                        else {
                          (*(local_80->super_OSObject)._vptr_OSObject[0xd])();
                        }
                        if (local_68 == 0) {
                          local_68 = newP11Object((OSObject *)
                                                  CONCAT17(in_stack_fffffffffffffd9f,
                                                           CONCAT16(in_stack_fffffffffffffd9e,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffd9d,
                                                  in_stack_fffffffffffffd98))),
                                                  (P11Object **)in_stack_fffffffffffffd90);
                          if (local_68 == 0) {
                            local_68 = P11Object::saveTemplate
                                                 (in_RDI,in_stack_fffffffffffffde0,
                                                  (bool)in_stack_fffffffffffffddf,
                                                  (CK_ATTRIBUTE_PTR)in_stack_fffffffffffffdd0,
                                                  (CK_ULONG)in_stack_fffffffffffffdc8,iVar3);
                            if (local_68 == 0) {
                              if (local_6a == 0) {
                                Slot::getSlotID(local_48);
                                CVar6 = HandleManager::addSessionObject
                                                  (in_stack_fffffffffffffe68,
                                                   in_stack_fffffffffffffe60,
                                                   (CK_SESSION_HANDLE)in_stack_fffffffffffffe58,
                                                   (bool)in_stack_fffffffffffffe57,
                                                   (CK_VOID_PTR)
                                                   CONCAT17(in_stack_fffffffffffffe4f,
                                                            in_stack_fffffffffffffe48));
                                *local_38 = CVar6;
                              }
                              else {
                                Slot::getSlotID(local_48);
                                CVar6 = HandleManager::addTokenObject
                                                  (in_stack_fffffffffffffe58,
                                                   CONCAT17(in_stack_fffffffffffffe57,
                                                            in_stack_fffffffffffffe50),
                                                   (bool)in_stack_fffffffffffffe4f,
                                                   in_stack_fffffffffffffe40);
                                *local_38 = CVar6;
                              }
                              local_8 = 0;
                            }
                            else {
                              (*(local_80->super_OSObject)._vptr_OSObject[0xe])();
                              local_8 = local_68;
                            }
                          }
                          else {
                            (*(local_80->super_OSObject)._vptr_OSObject[0xe])();
                            local_8 = local_68;
                          }
                        }
                        else {
                          (*(local_80->super_OSObject)._vptr_OSObject[0xe])();
                          local_8 = local_68;
                        }
                      }
                    }
                  }
                  else {
                    if (local_68 == 0x101) {
                      softHSMLog(6,"C_CopyObject",
                                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                                 ,0x67a,"User is not authorized");
                    }
                    if (local_68 == 0xb5) {
                      softHSMLog(6,"C_CopyObject",
                                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                                 ,0x67c,"Session is read-only");
                    }
                    local_8 = local_68;
                  }
                }
                else {
                  local_8 = 0xd1;
                }
              }
            }
            else {
              if (local_68 == 0x101) {
                softHSMLog(6,"C_CopyObject",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0x657,"User is not authorized");
              }
              local_8 = local_68;
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_CopyObject(CK_SESSION_HANDLE hSession, CK_OBJECT_HANDLE hObject, CK_ATTRIBUTE_PTR pTemplate, CK_ULONG ulCount, CK_OBJECT_HANDLE_PTR phNewObject)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pTemplate == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (phNewObject == NULL_PTR) return CKR_ARGUMENTS_BAD;
	*phNewObject = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the slot
	Slot* slot = session->getSlot();
	if (slot == NULL_PTR) return CKR_GENERAL_ERROR;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Check the object handle.
	OSObject *object = (OSObject *)handleManager->getObject(hObject);
	if (object == NULL_PTR || !object->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL wasOnToken = object->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL wasPrivate = object->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), wasOnToken, wasPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if the object is copyable
	CK_BBOOL isCopyable = object->getBooleanValue(CKA_COPYABLE, true);
	if (!isCopyable) return CKR_ACTION_PROHIBITED;

	// Extract critical information from the template
	CK_BBOOL isOnToken = wasOnToken;
	CK_BBOOL isPrivate = wasPrivate;

	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		if ((pTemplate[i].type == CKA_TOKEN) && (pTemplate[i].ulValueLen == sizeof(CK_BBOOL)))
		{
			isOnToken = *(CK_BBOOL*)pTemplate[i].pValue;
			continue;
		}
		if ((pTemplate[i].type == CKA_PRIVATE) && (pTemplate[i].ulValueLen == sizeof(CK_BBOOL)))
		{
			isPrivate = *(CK_BBOOL*)pTemplate[i].pValue;
			continue;
		}
	}

	// Check privacy does not downgrade
	if (wasPrivate && !isPrivate) return CKR_TEMPLATE_INCONSISTENT;

	// Check write user credentials
	rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Create the object in session or on the token
	OSObject *newobject = NULL_PTR;
	if (isOnToken)
	{
		newobject = (OSObject*) token->createObject();
	}
	else
	{
		newobject = sessionObjectStore->createObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE);
	}
	if (newobject == NULL) return CKR_GENERAL_ERROR;

	// Copy attributes from object class (CKA_CLASS=0 so the first)
	if (!newobject->startTransaction())
	{
		newobject->destroyObject();
		return CKR_FUNCTION_FAILED;
	}

	CK_ATTRIBUTE_TYPE attrType = CKA_CLASS;
	do
	{
		if (!object->attributeExists(attrType))
		{
			rv = CKR_FUNCTION_FAILED;
			break;
		}

		OSAttribute attr = object->getAttribute(attrType);

		// Upgrade privacy has to encrypt byte strings
		if (!wasPrivate && isPrivate &&
		    attr.isByteStringAttribute() &&
		    attr.getByteStringValue().size() != 0)
		{
			ByteString value;
			if (!token->encrypt(attr.getByteStringValue(), value) ||
			    !newobject->setAttribute(attrType, value))
			{
				rv = CKR_FUNCTION_FAILED;
				break;
			}
		}
		else
		{
			if (!newobject->setAttribute(attrType, attr))
			{
				rv = CKR_FUNCTION_FAILED;
				break;
			}
		}
		attrType = object->nextAttributeType(attrType);
	}
	while (attrType != CKA_CLASS);

	if (rv != CKR_OK)
	{
		newobject->abortTransaction();
	}
	else if (!newobject->commitTransaction())
	{
		rv = CKR_FUNCTION_FAILED;
	}

	if (rv != CKR_OK)
	{
		newobject->destroyObject();
		return rv;
	}

	// Get the new P11 object
	P11Object* newp11object = NULL;
	rv = newP11Object(newobject,&newp11object);
	if (rv != CKR_OK)
	{
		newobject->destroyObject();
		return rv;
	}

	// Apply the template
	rv = newp11object->saveTemplate(token, isPrivate != CK_FALSE, pTemplate, ulCount, OBJECT_OP_COPY);
	delete newp11object;

	if (rv != CKR_OK)
	{
		newobject->destroyObject();
		return rv;
	}

	// Set handle
	if (isOnToken)
	{
		*phNewObject = handleManager->addTokenObject(slot->getSlotID(), isPrivate != CK_FALSE, newobject);
	}
	else
	{
		*phNewObject = handleManager->addSessionObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE, newobject);
	}

	return CKR_OK;
}